

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

void __thiscall
LEARNER::learner<char,_example>::multipredict
          (learner<char,_example> *this,example *ec,size_t lo,size_t count,polyprediction *pred,
          bool finalize_predictions)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  size_t sVar4;
  uint64_t uVar5;
  size_t sVar6;
  int iVar7;
  bool bVar8;
  
  iVar7 = (int)lo;
  uVar5 = (ulong)(uint)(*(int *)(this + 0xe0) * iVar7) + (ec->super_example_predict).ft_offset;
  lVar1 = *(long *)(this + 0x40);
  (ec->super_example_predict).ft_offset = uVar5;
  if (lVar1 == 0) {
    sVar6 = count;
    while (bVar8 = sVar6 != 0, sVar6 = sVar6 - 1, bVar8) {
      (**(code **)(this + 0x30))(*(undefined8 *)(this + 0x18),*(undefined8 *)(this + 0x20),ec);
      if (finalize_predictions) {
        pfVar2 = (ec->pred).scalars._begin;
        pfVar3 = (ec->pred).scalars._end;
        sVar4 = (ec->pred).scalars.erase_count;
        (pred->scalars).end_array = (ec->pred).scalars.end_array;
        (pred->scalars).erase_count = sVar4;
        (pred->scalars)._begin = pfVar2;
        (pred->scalars)._end = pfVar3;
      }
      else {
        pred->scalar = ec->partial_prediction;
      }
      uVar5 = (ulong)*(uint *)(this + 0xe0) + (ec->super_example_predict).ft_offset;
      (ec->super_example_predict).ft_offset = uVar5;
      pred = pred + 1;
    }
    uVar5 = uVar5 - (uint)(((int)count + iVar7) * *(int *)(this + 0xe0));
  }
  else {
    (**(code **)(this + 0x40))
              (*(undefined8 *)(this + 0x18),*(undefined8 *)(this + 0x20),ec,count,
               *(undefined8 *)(this + 0xe0),pred,finalize_predictions);
    uVar5 = (ec->super_example_predict).ft_offset - (ulong)(uint)(iVar7 * *(int *)(this + 0xe0));
  }
  (ec->super_example_predict).ft_offset = uVar5;
  return;
}

Assistant:

inline void multipredict(E& ec, size_t lo, size_t count, polyprediction* pred, bool finalize_predictions)
  {
    assert((is_multiline && std::is_same<multi_ex, E>::value) ||
        (!is_multiline && std::is_same<example, E>::value));  // sanity check under debug compile
    if (learn_fd.multipredict_f == NULL)
    {
      increment_offset(ec, increment, lo);
      for (size_t c = 0; c < count; c++)
      {
        learn_fd.predict_f(learn_fd.data, *learn_fd.base, (void*)&ec);
        if (finalize_predictions)
          pred[c] = ec.pred;  // TODO: this breaks for complex labels because = doesn't do deep copy!
        else
          pred[c].scalar = ec.partial_prediction;
        // pred[c].scalar = finalize_prediction ec.partial_prediction; // TODO: this breaks for complex labels because =
        // doesn't do deep copy! // note works if ec.partial_prediction, but only if finalize_prediction is run????
        increment_offset(ec, increment, 1);
      }
      decrement_offset(ec, increment, lo + count);
    }
    else
    {
      increment_offset(ec, increment, lo);
      learn_fd.multipredict_f(learn_fd.data, *learn_fd.base, (void*)&ec, count, increment, pred, finalize_predictions);
      decrement_offset(ec, increment, lo);
    }
  }